

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

InterfacePortDef * __thiscall
kratos::InterfaceModPortDefinition::port
          (InterfacePortDef *__return_storage_ptr__,InterfaceModPortDefinition *this,string *name)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar4 [16];
  format_args args;
  string_view format_str;
  PortType local_124;
  _Self local_120;
  _Self local_118;
  PortDirection local_10c;
  type *ptStack_108;
  PortDirection port_dir;
  type *size;
  type *width;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *local_d8;
  undefined1 local_cd;
  string local_c0;
  string *local_a0;
  string *name_local;
  InterfaceModPortDefinition *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_88;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_a0 = name;
  name_local = (string *)this;
  this_local = (InterfaceModPortDefinition *)__return_storage_ptr__;
  uVar2 = (**(this->super_IDefinition)._vptr_IDefinition)(this,name);
  if ((uVar2 & 1) == 0) {
    local_cd = 1;
    auVar4 = __cxa_allocate_exception(0x10);
    local_38 = &local_c0;
    local_40 = "{0} does not exist";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_a0;
    local_68.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string_const&,char[19],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"{0} does not exist",(v7 *)local_a0,auVar4._8_8_,
                    (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                    "{0} does not exist");
    local_50 = &local_68;
    local_78 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = &local_88;
    local_30 = local_50;
    local_20 = local_50;
    local_10 = local_50;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_50->string);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_88.field_1.values_;
    format_str.size_ = local_88.desc_;
    format_str.data_ = (char *)local_78.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_c0,(detail *)local_78.data_,format_str,args);
    UserException::UserException(auVar4._0_8_,&local_c0);
    local_cd = 0;
    __cxa_throw(auVar4._0_8_,&UserException::typeinfo,UserException::~UserException);
  }
  peVar3 = std::
           __shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->def_);
  uVar2 = (**(peVar3->super_IDefinition)._vptr_IDefinition)(peVar3,local_a0);
  if ((uVar2 & 1) == 0) {
    peVar3 = std::
             __shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->def_);
    (*(peVar3->super_IDefinition)._vptr_IDefinition[3])
              ((pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &width,peVar3,local_a0);
    local_d8 = (pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &width;
    size = (type *)std::get<0ul,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                             ((pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&width);
    ptStack_108 = std::get<1ul,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            (local_d8);
    local_118._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->inputs_,local_a0);
    local_120._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->inputs_);
    bVar1 = std::operator!=(&local_118,&local_120);
    local_10c = (PortDirection)!bVar1;
    local_124 = Data;
    std::
    make_tuple<unsigned_int_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortDirection&,kratos::PortType>
              (__return_storage_ptr__,(uint *)size,ptStack_108,&local_10c,&local_124);
    std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~pair
              ((pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &width);
  }
  else {
    peVar3 = std::
             __shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->def_);
    (*(peVar3->super_IDefinition)._vptr_IDefinition[2])(__return_storage_ptr__,peVar3,local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

IDefinition::InterfacePortDef InterfaceModPortDefinition::port(const std::string& name) const {
    if (!has_port(name)) throw UserException(::format("{0} does not exist", name));
    if (def_->has_port(name)) {
        return def_->port(name);
    } else {
        // create a port def
        auto const& [width, size] = def_->var(name);
        auto port_dir =
            inputs_.find(name) != inputs_.end() ? PortDirection::In : PortDirection::Out;
        return std::make_tuple(width, size, port_dir, PortType::Data);
    }
}